

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall adios2::transport::FilePOSIX::SetParameters(FilePOSIX *this,Params *params)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"FailOnEOF",&local_39);
  helper::GetParameter<bool>(params,&local_38,&this->m_FailOnEOF);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FilePOSIX::SetParameters(const Params &params)
{
    // Parameters are set from config parameters if present
    // Otherwise, they are set from environment if present
    // Otherwise, they remain at their default value

    helper::GetParameter(params, "FailOnEOF", m_FailOnEOF);
}